

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<int,std::variant<int,float,std::__cxx11::string>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,int *expected,
          variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *actual)

{
  int *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  internal *local_30;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *actual_local;
  int *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = (internal *)expected;
  actual_local = (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)actual_str;
  expected_local = (int *)expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<int,float,std::__cxx11::string,int>
                    ((variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)expected,(int *)actual_str,
                     (type **)&iutest_type_traits::enabler_t<void>::value);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<int,std::variant<int,float,std::__cxx11::string>>
              (&local_50,(internal *)actual_local,(int *)local_30,
               (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)actual_str);
    FormatForComparisonFailureMessage<std::variant<int,float,std::__cxx11::string>,int>
              (&local_70,local_30,actual_local,(int *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }